

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsParser.cxx
# Opt level: O2

string * __thiscall
kws::Parser::GetLastErrors_abi_cxx11_(string *__return_storage_ptr__,Parser *this)

{
  char *pcVar1;
  pointer pEVar2;
  allocator local_31;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_31);
  for (pEVar2 = (this->m_ErrorList).
                super__Vector_base<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>._M_impl.
                super__Vector_impl_data._M_start;
      pEVar2 != (this->m_ErrorList).
                super__Vector_base<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>._M_impl.
                super__Vector_impl_data._M_finish; pEVar2 = pEVar2 + 1) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    pcVar1 = (char *)operator_new__(10);
    snprintf(pcVar1,10,"%ld",pEVar2->number);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    operator_delete__(pcVar1);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    pcVar1 = (char *)operator_new__(10);
    snprintf(pcVar1,10,"%ld",pEVar2->line);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    operator_delete__(pcVar1);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Parser::GetLastErrors()
{
  std::string output = "";
  std::vector<Error>::const_iterator it = m_ErrorList.begin();
  while(it != m_ErrorList.end())
    {
    output += "Error #";
    constexpr size_t length = 10;
    char* val = new char[length];
    snprintf(val,length,"%ld",(*it).number);
    output += val;
    delete [] val;
    output += " (";
    val = new char[length];
    snprintf(val,length,"%ld",(*it).line);
    output += val;
    delete [] val;
    output += ") ";
    output += (*it).description;
    output += "\n";
    it++;
    }
  return output;
}